

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

double cs_impl::math_cs_ext::log(double __x)

{
  numeric_float *in_RDX;
  numeric *in_RSI;
  numeric *in_RDI;
  longdouble in_ST1;
  longdouble in_ST3;
  double __x_00;
  double __x_01;
  double extraout_XMM0_Qa;
  longdouble local_28;
  numeric *local_10;
  
  local_10 = in_RSI;
  cs::numeric::as_float(in_RDX,in_RSI);
  std::log(__x_00);
  cs::numeric::as_float((numeric_float *)local_10,in_RSI);
  std::log(__x_01);
  local_28 = in_ST1 / in_ST3;
  cs::numeric::numeric<long_double>(in_RDI,&local_28);
  return extraout_XMM0_Qa;
}

Assistant:

numeric log(const numeric& a, const numeric& b)
		{
			return std::log(b.as_float()) / std::log(a.as_float());
		}